

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

int __thiscall cmCTestBuildHandler::ProcessHandler(cmCTestBuildHandler *this)

{
  char **ppcVar1;
  string *this_00;
  string *this_01;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmCTest *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  pointer pcVar6;
  char cVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  size_t sVar11;
  ostream *poVar12;
  long *plVar13;
  rep rVar14;
  _func_int **pp_Var15;
  char *extraout_RDX;
  char *extraout_RDX_00;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  char **ppcVar20;
  cmCTestBuildErrorWarning *evit;
  pointer pcVar21;
  cmDuration cVar22;
  string_view value;
  int retVal;
  ostringstream cmCTestLog_msg_14;
  string makeCommand;
  cmGeneratedFileStream xofs;
  cmXMLWriter xml;
  cmGeneratedFileStream ofs;
  cmStringReplaceHelper colorRemover;
  int local_8d8;
  undefined4 local_8d4;
  long *local_8d0;
  long local_8c0 [2];
  vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
  *local_8b0;
  undefined1 local_8a8 [112];
  ios_base local_838 [264];
  string local_730;
  undefined1 local_710 [8];
  undefined1 local_708 [104];
  ios_base local_6a0 [72];
  char *local_658;
  char *local_648;
  int local_640;
  string local_4a8;
  string local_488;
  string local_468;
  undefined1 local_448 [88];
  undefined1 local_3f0 [112];
  ios_base local_380 [504];
  cmStringReplaceHelper local_188;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"Build project",0xd);
  std::ios::widen((char)(ostringstream *)local_3f0 + (char)*(undefined8 *)(local_3f0._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_3f0);
  std::ostream::flush();
  pcVar4 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x126,(char *)local_710,(this->super_cmCTestGenericHandler).Quiet);
  if (local_710 != (undefined1  [8])(local_708 + 8)) {
    operator_delete((void *)local_710,(ulong)(local_708._8_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
  std::ios_base::~ios_base(local_380);
  cVar22 = cmCTest::GetRemainingTimeAllowed((this->super_cmCTestGenericHandler).CTest);
  iVar10 = 0;
  if (120.0 <= cVar22.__r) {
    local_8b0 = &this->ErrorWarningFileLineRegex;
    pcVar19 = "^Warning W[0-9]+ ([a-zA-Z.\\:/0-9_+ ~-]+) ([0-9]+):";
    lVar17 = 0;
    do {
      local_658 = (char *)0x0;
      local_648 = (char *)0x0;
      local_640 = 0;
      memset((RegularExpression *)local_708,0,0xaa);
      bVar9 = cmsys::RegularExpression::compile((RegularExpression *)local_708,pcVar19);
      if (bVar9) {
        local_710 = *(undefined1 (*) [8])((long)&cmCTestWarningErrorFileLine[0].FileIndex + lVar17);
        std::
        vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
        ::emplace_back<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>
                  (local_8b0,(cmCTestCompileErrorWarningRex *)local_710);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3f0,"Problem Compiling regular expression: ",0x26);
        sVar11 = strlen(pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,pcVar19,sVar11);
        cVar7 = (char)(ostringstream *)local_3f0;
        std::ios::widen((char)*(undefined8 *)(local_3f0._0_8_ + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x13b,(char *)local_8a8._0_8_,false);
        if ((undefined1 *)local_8a8._0_8_ != local_8a8 + 0x10) {
          operator_delete((void *)local_8a8._0_8_,local_8a8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
        std::ios_base::~ios_base(local_380);
      }
      if (local_648 != (char *)0x0) {
        operator_delete__(local_648);
      }
      pcVar19 = *(char **)((long)&cmCTestWarningErrorFileLine[1].RegularExpressionString + lVar17);
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0x80);
    GetMakeCommand_abi_cxx11_(&local_730,this);
    if (local_730._M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3f0,"Cannot find MakeCommand key in the DartConfiguration.tcl",
                 0x38);
      std::ios::widen((char)(ostream *)local_3f0 + (char)*(undefined8 *)(local_3f0._0_8_ + -0x18));
      std::ostream::put((char)local_3f0);
      std::ostream::flush();
      pcVar4 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x144,(char *)local_710,false);
      if (local_710 != (undefined1  [8])(local_708 + 8)) {
        operator_delete((void *)local_710,(ulong)(local_708._8_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
      std::ios_base::~ios_base(local_380);
      iVar10 = -1;
    }
    else {
      pcVar4 = (this->super_cmCTestGenericHandler).CTest;
      pcVar2 = local_3f0 + 0x10;
      local_3f0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"BuildDirectory","");
      cmCTest::GetCTestConfiguration(&local_468,pcVar4,(string *)local_3f0);
      if ((pointer)local_3f0._0_8_ != pcVar2) {
        operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
      }
      if (local_468._M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3f0,
                   "Cannot find BuildDirectory  key in the DartConfiguration.tcl",0x3c);
        std::ios::widen((char)(ostream *)local_3f0 + (char)*(undefined8 *)(local_3f0._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_3f0);
        std::ostream::flush();
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x14d,(char *)local_710,false);
        if (local_710 != (undefined1  [8])(local_708 + 8)) {
          operator_delete((void *)local_710,(ulong)(local_708._8_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
        std::ios_base::~ios_base(local_380);
        iVar10 = -1;
      }
      else {
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        local_3f0._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"UseLaunchers","");
        cmCTest::GetCTestConfiguration(&local_488,pcVar4,(string *)local_3f0);
        pcVar19 = extraout_RDX;
        if ((pointer)local_3f0._0_8_ != pcVar2) {
          operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
          pcVar19 = extraout_RDX_00;
        }
        value._M_str = pcVar19;
        value._M_len = (size_t)local_488._M_dataplus._M_p;
        bVar9 = cmValue::IsOn((cmValue *)local_488._M_string_length,value);
        this->UseCTestLaunch = bVar9;
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_3f0,None);
        local_8b0 = (vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
                     *)std::chrono::_V2::steady_clock::now();
        bVar9 = cmCTestGenericHandler::StartLogFile
                          (&this->super_cmCTestGenericHandler,"Build",
                           (cmGeneratedFileStream *)local_3f0);
        if (!bVar9) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_710,"Cannot create build log file",0x1c);
          std::ios::widen((char)(ostream *)local_710 +
                          (char)*(_func_int **)((long)local_710 + -0x18));
          std::ostream::put((char)local_710);
          std::ostream::flush();
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x15a,(char *)local_8a8._0_8_,false);
          if ((undefined1 *)local_8a8._0_8_ != local_8a8 + 0x10) {
            operator_delete((void *)local_8a8._0_8_,local_8a8._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
          std::ios_base::~ios_base(local_6a0);
        }
        if (cmCTestErrorMatches[0] != (char *)0x0) {
          ppcVar20 = cmCTestErrorMatches;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->CustomErrorMatches,ppcVar20);
            ppcVar1 = ppcVar20 + 1;
            ppcVar20 = ppcVar20 + 1;
          } while (*ppcVar1 != (char *)0x0);
        }
        if (cmCTestErrorExceptions[0] != (char *)0x0) {
          ppcVar20 = cmCTestErrorExceptions;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->CustomErrorExceptions,ppcVar20);
            ppcVar1 = ppcVar20 + 1;
            ppcVar20 = ppcVar20 + 1;
          } while (*ppcVar1 != (char *)0x0);
        }
        if (cmCTestWarningMatches[0] != (char *)0x0) {
          ppcVar20 = cmCTestWarningMatches;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->CustomWarningMatches,ppcVar20);
            ppcVar1 = ppcVar20 + 1;
            ppcVar20 = ppcVar20 + 1;
          } while (*ppcVar1 != (char *)0x0);
        }
        if (cmCTestWarningExceptions[0] != (char *)0x0) {
          ppcVar20 = cmCTestWarningExceptions;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->CustomWarningExceptions,ppcVar20);
            ppcVar1 = ppcVar20 + 1;
            ppcVar20 = ppcVar20 + 1;
          } while (*ppcVar1 != (char *)0x0);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorMatchRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
        poVar12 = std::ostream::_M_insert<void_const*>(local_710);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"Add this->ErrorMatchRegex",0x19)
        ;
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x17e,(char *)local_8a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_8a8._0_8_ != local_8a8 + 0x10) {
          operator_delete((void *)local_8a8._0_8_,local_8a8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
        std::ios_base::~ios_base(local_6a0);
        pbVar16 = (this->CustomErrorMatches).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 = (this->CustomErrorMatches).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar16 != pbVar5) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_710,"Add this->CustomErrorMatches: ",0x1e);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_710,(pbVar16->_M_dataplus)._M_p,
                                 pbVar16->_M_string_length);
            std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            pcVar4 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar4,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x17e,(char *)local_8a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((undefined1 *)local_8a8._0_8_ != local_8a8 + 0x10) {
              operator_delete((void *)local_8a8._0_8_,local_8a8._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
            std::ios_base::~ios_base(local_6a0);
            std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                       &this->ErrorMatchRegex,pbVar16);
            pbVar16 = pbVar16 + 1;
          } while (pbVar16 != pbVar5);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorExceptionRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
        poVar12 = std::ostream::_M_insert<void_const*>(local_710);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"Add this->ErrorExceptionRegex",0x1d);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x180,(char *)local_8a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_8a8._0_8_ != local_8a8 + 0x10) {
          operator_delete((void *)local_8a8._0_8_,local_8a8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
        std::ios_base::~ios_base(local_6a0);
        pbVar16 = (this->CustomErrorExceptions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 = (this->CustomErrorExceptions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar16 != pbVar5) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_710,"Add this->CustomErrorExceptions: ",0x21);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_710,(pbVar16->_M_dataplus)._M_p,
                                 pbVar16->_M_string_length);
            std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            pcVar4 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar4,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x180,(char *)local_8a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((undefined1 *)local_8a8._0_8_ != local_8a8 + 0x10) {
              operator_delete((void *)local_8a8._0_8_,local_8a8._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
            std::ios_base::~ios_base(local_6a0);
            std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                       &this->ErrorExceptionRegex,pbVar16);
            pbVar16 = pbVar16 + 1;
          } while (pbVar16 != pbVar5);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningMatchRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
        poVar12 = std::ostream::_M_insert<void_const*>(local_710);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"Add this->WarningMatchRegex",0x1b);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x182,(char *)local_8a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_8a8._0_8_ != local_8a8 + 0x10) {
          operator_delete((void *)local_8a8._0_8_,local_8a8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
        std::ios_base::~ios_base(local_6a0);
        pbVar16 = (this->CustomWarningMatches).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 = (this->CustomWarningMatches).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar16 != pbVar5) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_710,"Add this->CustomWarningMatches: ",0x20);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_710,(pbVar16->_M_dataplus)._M_p,
                                 pbVar16->_M_string_length);
            std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            pcVar4 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar4,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x182,(char *)local_8a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((undefined1 *)local_8a8._0_8_ != local_8a8 + 0x10) {
              operator_delete((void *)local_8a8._0_8_,local_8a8._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
            std::ios_base::~ios_base(local_6a0);
            std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                       &this->WarningMatchRegex,pbVar16);
            pbVar16 = pbVar16 + 1;
          } while (pbVar16 != pbVar5);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningExceptionRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
        poVar12 = std::ostream::_M_insert<void_const*>(local_710);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"Add this->WarningExceptionRegex",0x1f);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar4,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x184,(char *)local_8a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_8a8._0_8_ != local_8a8 + 0x10) {
          operator_delete((void *)local_8a8._0_8_,local_8a8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
        std::ios_base::~ios_base(local_6a0);
        pbVar16 = (this->CustomWarningExceptions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 = (this->CustomWarningExceptions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar16 != pbVar5) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_710,"Add this->CustomWarningExceptions: ",0x23);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_710,(pbVar16->_M_dataplus)._M_p,
                                 pbVar16->_M_string_length);
            std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            pcVar4 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar4,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x184,(char *)local_8a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((undefined1 *)local_8a8._0_8_ != local_8a8 + 0x10) {
              operator_delete((void *)local_8a8._0_8_,local_8a8._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
            std::ios_base::~ios_base(local_6a0);
            std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                       &this->WarningExceptionRegex,pbVar16);
            pbVar16 = pbVar16 + 1;
          } while (pbVar16 != pbVar5);
        }
        (this->SimplifySourceDir)._M_string_length = 0;
        *(this->SimplifySourceDir)._M_dataplus._M_p = '\0';
        (this->SimplifyBuildDir)._M_string_length = 0;
        *(this->SimplifyBuildDir)._M_dataplus._M_p = '\0';
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        local_8a8._0_8_ = local_8a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_8a8,"SourceDirectory","");
        cmCTest::GetCTestConfiguration((string *)local_710,pcVar4,(string *)local_8a8);
        uVar8 = local_708._0_8_;
        if (local_710 != (undefined1  [8])(local_708 + 8)) {
          operator_delete((void *)local_710,(ulong)(local_708._8_8_ + 1));
        }
        if ((undefined1 *)local_8a8._0_8_ != local_8a8 + 0x10) {
          operator_delete((void *)local_8a8._0_8_,local_8a8._16_8_ + 1);
        }
        this_00 = &this->SimplifySourceDir;
        paVar3 = &local_188.ErrorString.field_2;
        if (&DAT_00000014 < (ulong)uVar8) {
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          local_188.ErrorString._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"SourceDirectory","")
          ;
          cmCTest::GetCTestConfiguration((string *)local_8a8,pcVar4,&local_188.ErrorString);
          plVar13 = (long *)std::__cxx11::string::append(local_8a8);
          local_710 = (undefined1  [8])(local_708 + 8);
          pp_Var15 = (_func_int **)(plVar13 + 2);
          if ((_func_int **)*plVar13 == pp_Var15) {
            local_708._8_8_ = *pp_Var15;
            local_708._16_8_ = plVar13[3];
          }
          else {
            local_708._8_8_ = *pp_Var15;
            local_710 = (undefined1  [8])*plVar13;
          }
          local_708._0_8_ = plVar13[1];
          *plVar13 = (long)pp_Var15;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          if ((undefined1 *)local_8a8._0_8_ != local_8a8 + 0x10) {
            operator_delete((void *)local_8a8._0_8_,local_8a8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.ErrorString._M_dataplus._M_p != paVar3) {
            operator_delete(local_188.ErrorString._M_dataplus._M_p,
                            local_188.ErrorString.field_2._M_allocated_capacity + 1);
          }
          lVar17 = std::__cxx11::string::rfind((char)local_710,0x2f);
          if (lVar17 != -1) {
            std::__cxx11::string::resize((ulong)local_710,(char)lVar17 + '\x01');
            std::__cxx11::string::operator=((string *)this_00,(string *)local_710);
          }
          if (local_710 != (undefined1  [8])(local_708 + 8)) {
            operator_delete((void *)local_710,(ulong)(local_708._8_8_ + 1));
          }
        }
        pcVar4 = (this->super_cmCTestGenericHandler).CTest;
        local_8a8._0_8_ = local_8a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_8a8,"BuildDirectory","");
        cmCTest::GetCTestConfiguration((string *)local_710,pcVar4,(string *)local_8a8);
        uVar8 = local_708._0_8_;
        if (local_710 != (undefined1  [8])(local_708 + 8)) {
          operator_delete((void *)local_710,(ulong)(local_708._8_8_ + 1));
        }
        if ((undefined1 *)local_8a8._0_8_ != local_8a8 + 0x10) {
          operator_delete((void *)local_8a8._0_8_,local_8a8._16_8_ + 1);
        }
        this_01 = &this->SimplifyBuildDir;
        if (&DAT_00000014 < (ulong)uVar8) {
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          local_188.ErrorString._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"BuildDirectory","");
          cmCTest::GetCTestConfiguration((string *)local_8a8,pcVar4,&local_188.ErrorString);
          plVar13 = (long *)std::__cxx11::string::append(local_8a8);
          local_710 = (undefined1  [8])(local_708 + 8);
          pp_Var15 = (_func_int **)(plVar13 + 2);
          if ((_func_int **)*plVar13 == pp_Var15) {
            local_708._8_8_ = *pp_Var15;
            local_708._16_8_ = plVar13[3];
          }
          else {
            local_708._8_8_ = *pp_Var15;
            local_710 = (undefined1  [8])*plVar13;
          }
          local_708._0_8_ = plVar13[1];
          *plVar13 = (long)pp_Var15;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          if ((undefined1 *)local_8a8._0_8_ != local_8a8 + 0x10) {
            operator_delete((void *)local_8a8._0_8_,local_8a8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.ErrorString._M_dataplus._M_p != paVar3) {
            operator_delete(local_188.ErrorString._M_dataplus._M_p,
                            local_188.ErrorString.field_2._M_allocated_capacity + 1);
          }
          lVar17 = std::__cxx11::string::rfind((char)local_710,0x2f);
          if (lVar17 != -1) {
            std::__cxx11::string::resize((ulong)local_710,(char)lVar17 + '\x01');
            std::__cxx11::string::operator=((string *)this_01,(string *)local_710);
          }
          if (local_710 != (undefined1  [8])(local_708 + 8)) {
            operator_delete((void *)local_710,(ulong)(local_708._8_8_ + 1));
          }
        }
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)local_710,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->StartBuild,(string *)local_710);
        if (local_710 != (undefined1  [8])(local_708 + 8)) {
          operator_delete((void *)local_710,(ulong)(local_708._8_8_ + 1));
        }
        rVar14 = std::chrono::_V2::system_clock::now();
        (this->StartBuildTime).__d.__r = rVar14;
        local_710 = (undefined1  [8])(local_708 + 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"\x1b\\[[0-9;]*m","");
        local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"");
        cmStringReplaceHelper::cmStringReplaceHelper
                  (&local_188,(string *)local_710,&local_4a8,(cmMakefile *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
        }
        if (local_710 != (undefined1  [8])(local_708 + 8)) {
          operator_delete((void *)local_710,(ulong)(local_708._8_8_ + 1));
        }
        this->ColorRemover = &local_188;
        local_8d8 = 0;
        bVar9 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
        if (bVar9) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_710,"Build with command: ",0x14);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_710,local_730._M_dataplus._M_p,
                               local_730._M_string_length);
          std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1ac,(char *)local_8a8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
          if ((undefined1 *)local_8a8._0_8_ != local_8a8 + 0x10) {
            operator_delete((void *)local_8a8._0_8_,local_8a8._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
          std::ios_base::~ios_base(local_6a0);
          local_8d4 = 0;
        }
        else {
          iVar10 = RunMakeCommand(this,&local_730,&local_8d8,local_468._M_dataplus._M_p,0,
                                  (ostream *)local_3f0,Auto);
          local_8d4 = CONCAT31((int3)((uint)iVar10 >> 8),iVar10 != 4);
        }
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)local_710,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->EndBuild,(string *)local_710);
        if (local_710 != (undefined1  [8])(local_708 + 8)) {
          operator_delete((void *)local_710,(ulong)(local_708._8_8_ + 1));
        }
        rVar14 = std::chrono::_V2::system_clock::now();
        (this->EndBuildTime).__d.__r = rVar14;
        lVar17 = std::chrono::_V2::steady_clock::now();
        if ((this->SimplifySourceDir)._M_string_length != 0) {
          pcVar6 = (this->ErrorsAndWarnings).
                   super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pcVar21 = (this->ErrorsAndWarnings).
                         super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                         ._M_impl.super__Vector_impl_data._M_start; pcVar21 != pcVar6;
              pcVar21 = pcVar21 + 1) {
            cmsys::SystemTools::ReplaceString(&pcVar21->Text,(this_00->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar21->PreContext,(this_00->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar21->PostContext,(this_00->_M_dataplus)._M_p,"/.../");
          }
        }
        if ((this->SimplifyBuildDir)._M_string_length != 0) {
          pcVar6 = (this->ErrorsAndWarnings).
                   super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pcVar21 = (this->ErrorsAndWarnings).
                         super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                         ._M_impl.super__Vector_impl_data._M_start; pcVar21 != pcVar6;
              pcVar21 = pcVar21 + 1) {
            cmsys::SystemTools::ReplaceString(&pcVar21->Text,(this_01->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar21->PreContext,(this_01->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar21->PostContext,(this_01->_M_dataplus)._M_p,"/.../");
          }
        }
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_710,None);
        bVar9 = cmCTestGenericHandler::StartResultingXML
                          (&this->super_cmCTestGenericHandler,PartBuild,"Build",
                           (cmGeneratedFileStream *)local_710);
        if (bVar9) {
          cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_448,(ostream *)local_710,0);
          GenerateXMLHeader(this,(cmXMLWriter *)local_448);
          if (this->UseCTestLaunch == true) {
            GenerateXMLLaunched(this,(cmXMLWriter *)local_448);
          }
          else {
            GenerateXMLLogScraped(this,(cmXMLWriter *)local_448);
          }
          GenerateXMLFooter(this,(cmXMLWriter *)local_448,
                            (cmDuration)((double)(lVar17 - (long)local_8b0) / 1000000000.0));
          if (((char)local_8d4 != '\0' || local_8d8 != 0) || (0 < this->TotalErrors)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_8a8,"Error(s) when building project",0x1e);
            std::ios::widen((char)(ostream *)local_8a8 +
                            (char)*(undefined8 *)(local_8a8._0_8_ + -0x18));
            std::ostream::put((char)local_8a8);
            std::ostream::flush();
            pcVar4 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar4,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x1de,(char *)local_8d0,false);
            if (local_8d0 != local_8c0) {
              operator_delete(local_8d0,local_8c0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8a8);
            std::ios_base::~ios_base(local_838);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_8a8,"   ",3);
          poVar12 = (ostream *)std::ostream::operator<<(local_8a8,this->TotalErrors);
          pcVar19 = " or more";
          pcVar18 = " or more";
          if (this->TotalErrors < this->MaxErrors) {
            pcVar18 = "";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,pcVar18,(ulong)(this->MaxErrors <= this->TotalErrors) << 3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," Compiler errors",0x10);
          std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1e5,(char *)local_8d0,false);
          if (local_8d0 != local_8c0) {
            operator_delete(local_8d0,local_8c0[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8a8);
          std::ios_base::~ios_base(local_838);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_8a8,"   ",3);
          poVar12 = (ostream *)std::ostream::operator<<(local_8a8,this->TotalWarnings);
          if (this->TotalWarnings < this->MaxWarnings) {
            pcVar19 = "";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,pcVar19,(ulong)(this->MaxWarnings <= this->TotalWarnings) << 3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," Compiler warnings",0x12);
          std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1ea,(char *)local_8d0,false);
          if (local_8d0 != local_8c0) {
            operator_delete(local_8d0,local_8c0[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8a8);
          std::ios_base::~ios_base(local_838);
          iVar10 = local_8d8;
          cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_448);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_8a8,"Cannot create build XML file",0x1c);
          std::ios::widen((char)(ostream *)local_8a8 +
                          (char)*(undefined8 *)(local_8a8._0_8_ + -0x18));
          std::ostream::put((char)local_8a8);
          std::ostream::flush();
          pcVar4 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1d0,(char *)local_448._0_8_,false);
          if ((ostream *)local_448._0_8_ != (ostream *)(local_448 + 0x10)) {
            operator_delete((void *)local_448._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_448._16_8_)->_M_p + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8a8);
          std::ios_base::~ios_base(local_838);
          iVar10 = -1;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_710);
        std::
        vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
        ::~vector(&local_188.Replacements);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188.ReplaceExpression._M_dataplus._M_p != &local_188.ReplaceExpression.field_2)
        {
          operator_delete(local_188.ReplaceExpression._M_dataplus._M_p,
                          local_188.ReplaceExpression.field_2._M_allocated_capacity + 1);
        }
        if (local_188.RegularExpression.program != (char *)0x0) {
          operator_delete__(local_188.RegularExpression.program);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188.RegExString._M_dataplus._M_p != &local_188.RegExString.field_2) {
          operator_delete(local_188.RegExString._M_dataplus._M_p,
                          local_188.RegExString.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188.ErrorString._M_dataplus._M_p != &local_188.ErrorString.field_2) {
          operator_delete(local_188.ErrorString._M_dataplus._M_p,
                          local_188.ErrorString.field_2._M_allocated_capacity + 1);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_3f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._M_dataplus._M_p != &local_488.field_2) {
          operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_730._M_dataplus._M_p != &local_730.field_2) {
      operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar10;
}

Assistant:

int cmCTestBuildHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "Build project" << std::endl,
                     this->Quiet);

  // do we have time for this
  if (this->CTest->GetRemainingTimeAllowed() < std::chrono::minutes(2)) {
    return 0;
  }

  int entry;
  for (entry = 0; cmCTestWarningErrorFileLine[entry].RegularExpressionString;
       ++entry) {
    cmCTestBuildHandler::cmCTestCompileErrorWarningRex r;
    if (r.RegularExpression.compile(
          cmCTestWarningErrorFileLine[entry].RegularExpressionString)) {
      r.FileIndex = cmCTestWarningErrorFileLine[entry].FileIndex;
      r.LineIndex = cmCTestWarningErrorFileLine[entry].LineIndex;
      this->ErrorWarningFileLineRegex.push_back(std::move(r));
    } else {
      cmCTestLog(
        this->CTest, ERROR_MESSAGE,
        "Problem Compiling regular expression: "
          << cmCTestWarningErrorFileLine[entry].RegularExpressionString
          << std::endl);
    }
  }

  // Determine build command and build directory
  std::string makeCommand = this->GetMakeCommand();
  if (makeCommand.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find MakeCommand key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  const std::string& buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  std::string const& useLaunchers =
    this->CTest->GetCTestConfiguration("UseLaunchers");
  this->UseCTestLaunch = cmIsOn(useLaunchers);

  // Create a last build log
  cmGeneratedFileStream ofs;
  auto elapsed_time_start = std::chrono::steady_clock::now();
  if (!this->StartLogFile("Build", ofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build log file" << std::endl);
  }

  // Create lists of regular expression strings for errors, error exceptions,
  // warnings and warning exceptions.
  std::vector<std::string>::size_type cc;
  for (cc = 0; cmCTestErrorMatches[cc]; cc++) {
    this->CustomErrorMatches.emplace_back(cmCTestErrorMatches[cc]);
  }
  for (cc = 0; cmCTestErrorExceptions[cc]; cc++) {
    this->CustomErrorExceptions.emplace_back(cmCTestErrorExceptions[cc]);
  }
  for (cc = 0; cmCTestWarningMatches[cc]; cc++) {
    this->CustomWarningMatches.emplace_back(cmCTestWarningMatches[cc]);
  }

  for (cc = 0; cmCTestWarningExceptions[cc]; cc++) {
    this->CustomWarningExceptions.emplace_back(cmCTestWarningExceptions[cc]);
  }

  // Pre-compile regular expressions objects for all regular expressions

#define cmCTestBuildHandlerPopulateRegexVector(strings, regexes)              \
  do {                                                                        \
    regexes.clear();                                                          \
    cmCTestOptionalLog(this->CTest, DEBUG,                                    \
                       this << "Add " #regexes << std::endl, this->Quiet);    \
    for (std::string const& s : (strings)) {                                  \
      cmCTestOptionalLog(this->CTest, DEBUG,                                  \
                         "Add " #strings ": " << s << std::endl,              \
                         this->Quiet);                                        \
      (regexes).emplace_back(s);                                              \
    }                                                                         \
  } while (false)

  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorMatches,
                                         this->ErrorMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorExceptions,
                                         this->ErrorExceptionRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningMatches,
                                         this->WarningMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningExceptions,
                                         this->WarningExceptionRegex);

  // Determine source and binary tree substitutions to simplify the output.
  this->SimplifySourceDir.clear();
  this->SimplifyBuildDir.clear();
  if (this->CTest->GetCTestConfiguration("SourceDirectory").size() > 20) {
    std::string srcdir =
      this->CTest->GetCTestConfiguration("SourceDirectory") + "/";
    cc = srcdir.rfind('/', srcdir.size() - 2);
    if (cc != std::string::npos) {
      srcdir.resize(cc + 1);
      this->SimplifySourceDir = std::move(srcdir);
    }
  }
  if (this->CTest->GetCTestConfiguration("BuildDirectory").size() > 20) {
    std::string bindir =
      this->CTest->GetCTestConfiguration("BuildDirectory") + "/";
    cc = bindir.rfind('/', bindir.size() - 2);
    if (cc != std::string::npos) {
      bindir.resize(cc + 1);
      this->SimplifyBuildDir = std::move(bindir);
    }
  }

  // Ok, let's do the build

  // Remember start build time
  this->StartBuild = this->CTest->CurrentTime();
  this->StartBuildTime = std::chrono::system_clock::now();

  cmStringReplaceHelper colorRemover("\x1b\\[[0-9;]*m", "", nullptr);
  this->ColorRemover = &colorRemover;
  int retVal = 0;
  int res = cmsysProcess_State_Exited;
  if (!this->CTest->GetShowOnly()) {
    res = this->RunMakeCommand(makeCommand, &retVal, buildDirectory.c_str(), 0,
                               ofs);
  } else {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Build with command: " << makeCommand << std::endl,
                       this->Quiet);
  }

  // Remember end build time and calculate elapsed time
  this->EndBuild = this->CTest->CurrentTime();
  this->EndBuildTime = std::chrono::system_clock::now();
  auto elapsed_build_time =
    std::chrono::steady_clock::now() - elapsed_time_start;

  // Cleanups strings in the errors and warnings list.
  if (!this->SimplifySourceDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifySourceDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
    }
  }

  if (!this->SimplifyBuildDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifyBuildDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
    }
  }

  // Generate XML output
  cmGeneratedFileStream xofs;
  if (!this->StartResultingXML(cmCTest::PartBuild, "Build", xofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build XML file" << std::endl);
    return -1;
  }
  cmXMLWriter xml(xofs);
  this->GenerateXMLHeader(xml);
  if (this->UseCTestLaunch) {
    this->GenerateXMLLaunched(xml);
  } else {
    this->GenerateXMLLogScraped(xml);
  }
  this->GenerateXMLFooter(xml, elapsed_build_time);

  if (res != cmsysProcess_State_Exited || retVal || this->TotalErrors > 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error(s) when building project" << std::endl);
  }

  // Display message about number of errors and warnings
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   " << this->TotalErrors
                   << (this->TotalErrors >= this->MaxErrors ? " or more" : "")
                   << " Compiler errors" << std::endl);
  cmCTestLog(
    this->CTest, HANDLER_OUTPUT,
    "   " << this->TotalWarnings
          << (this->TotalWarnings >= this->MaxWarnings ? " or more" : "")
          << " Compiler warnings" << std::endl);

  return retVal;
}